

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbfgs.c
# Opt level: O1

void trn_lbfgs(mdl_t *mdl)

{
  undefined8 uVar1;
  undefined8 uVar2;
  opt_t *poVar3;
  char *pcVar4;
  uint uVar5;
  size_t sVar6;
  grd_t *pgVar7;
  mdl_t *pmVar8;
  double *x;
  _Bool _Var9;
  int iVar10;
  uint64_t f_1;
  double *pdVar11;
  double *pdVar12;
  FILE *pFVar13;
  double dVar14;
  uint64_t uVar15;
  double *pdVar16;
  undefined1 *puVar17;
  long lVar18;
  uint uVar19;
  uint32_t uVar20;
  ulong uVar21;
  double *pdVar22;
  ulong uVar23;
  uint64_t uVar24;
  long lVar25;
  bool bVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined8 uStack_140;
  double local_138;
  double *local_130;
  ulong local_128;
  double local_120;
  uint64_t nftr;
  ulong local_110;
  undefined1 *local_108;
  size_t local_100;
  int local_f8;
  int local_f4;
  int type;
  int histsz;
  uint64_t f;
  grd_t *local_e0;
  double *local_d8;
  double *local_d0;
  uint local_c4;
  double *local_c0;
  undefined1 *local_b8;
  double local_b0;
  double local_a8;
  mdl_t *local_a0;
  double *local_98;
  uint32_t local_8c;
  uint64_t local_88;
  double local_80;
  double *local_78;
  long local_70;
  ulong local_68;
  long local_60;
  double local_58;
  double *local_50;
  double local_48;
  ulong local_40;
  char local_31;
  
  poVar3 = mdl->opt;
  uVar24 = mdl->nftr;
  local_8c = poVar3->maxiter;
  local_110 = (ulong)poVar3->objwin;
  uVar23 = (ulong)(poVar3->lbfgs).histsz;
  local_a8 = poVar3->rho1;
  local_128 = uVar23 * 8 + 0xf & 0xfffffffffffffff0;
  local_60 = (long)&local_138 - local_128;
  lVar25 = local_60 - local_128;
  local_88 = lVar25 - local_128;
  puVar17 = (undefined1 *)(local_88 - (local_110 * 8 + 0xf & 0xfffffffffffffff0));
  local_50 = mdl->theta;
  local_108 = puVar17;
  local_a0 = mdl;
  *(undefined8 *)(puVar17 + -8) = 0x10a3b7;
  pdVar11 = xvm_new(uVar24);
  *(undefined8 *)(puVar17 + -8) = 0x10a3c2;
  local_78 = xvm_new(uVar24);
  *(undefined8 *)(puVar17 + -8) = 0x10a3ce;
  local_c0 = xvm_new(uVar24);
  *(undefined8 *)(puVar17 + -8) = 0x10a3dd;
  local_d0 = xvm_new(uVar24);
  if (uVar23 != 0) {
    uVar21 = 0;
    do {
      *(undefined8 *)(puVar17 + -8) = 0x10a3f3;
      pdVar12 = xvm_new(uVar24);
      *(double **)(local_60 + uVar21 * 8) = pdVar12;
      *(undefined8 *)(puVar17 + -8) = 0x10a403;
      pdVar12 = xvm_new(uVar24);
      *(double **)(lVar25 + uVar21 * 8) = pdVar12;
      uVar21 = uVar21 + 1;
    } while (uVar23 != uVar21);
  }
  local_40 = uVar23;
  if ((local_a8 != 0.0) || (NAN(local_a8))) {
    *(undefined8 *)(puVar17 + -8) = 0x10a43c;
    local_98 = xvm_new(uVar24);
  }
  else {
    local_98 = (double *)0x0;
  }
  pdVar12 = local_78;
  pmVar8 = local_a0;
  *(undefined8 *)(puVar17 + -8) = 0x10a456;
  local_e0 = grd_new(pmVar8,pdVar12);
  pcVar4 = pmVar8->opt->rstate;
  f = uVar24;
  local_d8 = pdVar11;
  local_70 = lVar25;
  if (pcVar4 != (char *)0x0) {
    *(undefined8 *)(puVar17 + -8) = 0x10a48b;
    pFVar13 = fopen(pcVar4,"r");
    if (pFVar13 == (FILE *)0x0) {
      *(undefined8 *)(puVar17 + -8) = 0x10a4a1;
      fatal("failed to open input state file");
    }
    *(undefined8 *)(puVar17 + -8) = 0x10a4c7;
    iVar10 = __isoc99_fscanf(pFVar13,"#state#%d#%d#%lu\n",&local_f8,&local_f4,&local_120);
    if (iVar10 != 3) {
      *(undefined8 *)(puVar17 + -8) = 0x10a4e1;
      fatal("0 %s","invalid state file");
    }
    if ((local_f8 != 0) || (local_f4 != (int)local_40)) {
      *(undefined8 *)(puVar17 + -8) = 0x10a504;
      fatal("state is not compatible");
    }
    if (local_120 != 0.0) {
      dVar14 = 0.0;
      do {
        uVar23 = local_40;
        local_48 = dVar14;
        *(undefined8 *)(puVar17 + -8) = 0x10a542;
        iVar10 = __isoc99_fscanf(pFVar13,"%lu",&type);
        if (iVar10 != 1) {
          *(undefined8 *)(puVar17 + -8) = 0x10a558;
          fatal("1 %s","invalid state file");
        }
        pdVar12 = pdVar11 + _type;
        pdVar22 = local_c0 + _type;
        *(undefined8 *)(puVar17 + -8) = 0x10a57f;
        iVar10 = __isoc99_fscanf(pFVar13,"%la %la",pdVar12,pdVar22);
        if (iVar10 != 2) {
          *(undefined8 *)(puVar17 + -8) = 0x10a595;
          fatal("2 %s","invalid state file");
        }
        if ((int)uVar23 != 0) {
          uVar23 = 0;
          do {
            lVar18 = _type * 8;
            lVar25 = *(long *)(local_60 + uVar23 * 8);
            *(undefined8 *)(puVar17 + -8) = 0x10a5bd;
            iVar10 = __isoc99_fscanf(pFVar13,"%la",lVar18 + lVar25);
            if (iVar10 != 1) {
              *(undefined8 *)(puVar17 + -8) = 0x10a5d3;
              fatal("3 %s","invalid state file");
            }
            lVar18 = _type * 8;
            lVar25 = *(long *)(local_70 + uVar23 * 8);
            *(undefined8 *)(puVar17 + -8) = 0x10a5f3;
            iVar10 = __isoc99_fscanf(pFVar13,"%la",lVar18 + lVar25);
            if (iVar10 != 1) {
              *(undefined8 *)(puVar17 + -8) = 0x10a609;
              fatal("4 %s","invalid state file");
            }
            uVar23 = uVar23 + 1;
          } while (local_40 != uVar23);
        }
        dVar14 = (double)((long)local_48 + 1);
      } while ((ulong)dVar14 < (ulong)local_120);
    }
    uVar23 = local_40;
    lVar25 = local_70;
    uVar24 = local_88;
    if ((int)local_40 != 0) {
      uVar21 = 0;
      do {
        uVar15 = f;
        pdVar11 = *(double **)(lVar25 + uVar21 * 8);
        pdVar12 = *(double **)(local_60 + uVar21 * 8);
        *(undefined8 *)(puVar17 + -8) = 0x10a658;
        dVar14 = xvm_dot(pdVar11,pdVar12,uVar15);
        *(double *)(uVar24 + uVar21 * 8) = 1.0 / dVar14;
        uVar21 = uVar21 + 1;
      } while (uVar23 != uVar21);
    }
    *(undefined8 *)(puVar17 + -8) = 0x10a681;
    fclose(pFVar13);
  }
  pdVar11 = local_d8;
  pgVar7 = local_e0;
  uVar24 = f;
  *(undefined8 *)(puVar17 + -8) = 0x10a69b;
  local_58 = grd_gradient(pgVar7);
  if (local_8c == 0 || uit_stop != false) {
LAB_0010adca:
    pcVar4 = local_a0->opt->sstate;
    if (pcVar4 != (char *)0x0) {
      *(undefined8 *)(puVar17 + -8) = 0x10aded;
      pFVar13 = fopen(pcVar4,"w");
      uVar23 = local_40;
      if (pFVar13 == (FILE *)0x0) {
        *(undefined8 *)(puVar17 + -8) = 0x10ae03;
        fatal("failed to open output state file");
      }
      *(undefined8 *)(puVar17 + -8) = 0x10ae1b;
      fprintf(pFVar13,"#state#0#%u#%lu\n",uVar23,uVar24);
      if (uVar24 != 0) {
        uVar24 = 0;
        do {
          *(undefined8 *)(puVar17 + -8) = 0x10ae42;
          fprintf(pFVar13,"%lu",uVar24);
          dVar14 = pdVar11[uVar24];
          dVar27 = local_c0[uVar24];
          *(undefined8 *)(puVar17 + -8) = 0x10ae62;
          fprintf(pFVar13," %la %la",dVar14,dVar27);
          uVar23 = local_40;
          lVar18 = local_60;
          lVar25 = local_70;
          if ((int)local_40 != 0) {
            uVar21 = 0;
            local_88 = uVar24;
            do {
              uVar1 = *(undefined8 *)(*(long *)(lVar18 + uVar21 * 8) + local_88 * 8);
              uVar2 = *(undefined8 *)(*(long *)(lVar25 + uVar21 * 8) + local_88 * 8);
              *(undefined8 *)(puVar17 + -8) = 0x10aea7;
              fprintf(pFVar13," %la %la",uVar1,uVar2);
              uVar21 = uVar21 + 1;
              uVar24 = local_88;
            } while (uVar23 != uVar21);
          }
          *(undefined8 *)(puVar17 + -8) = 0x10aec9;
          fputc(10,pFVar13);
          uVar24 = uVar24 + 1;
          pdVar11 = local_d8;
        } while (uVar24 != f);
      }
      *(undefined8 *)(puVar17 + -8) = 0x10aef2;
      fclose(pFVar13);
    }
    *(undefined8 *)(puVar17 + -8) = 0x10aefa;
    xvm_free(pdVar11);
    pdVar11 = local_78;
    *(undefined8 *)(puVar17 + -8) = 0x10af03;
    xvm_free(pdVar11);
    pdVar11 = local_c0;
    *(undefined8 *)(puVar17 + -8) = 0x10af0f;
    xvm_free(pdVar11);
    pdVar11 = local_d0;
    *(undefined8 *)(puVar17 + -8) = 0x10af1b;
    xvm_free(pdVar11);
    uVar23 = local_40;
    lVar18 = local_60;
    lVar25 = local_70;
    if ((int)local_40 != 0) {
      uVar21 = 0;
      do {
        pdVar11 = *(double **)(lVar18 + uVar21 * 8);
        *(undefined8 *)(puVar17 + -8) = 0x10af37;
        xvm_free(pdVar11);
        pdVar11 = *(double **)(lVar25 + uVar21 * 8);
        *(undefined8 *)(puVar17 + -8) = 0x10af40;
        xvm_free(pdVar11);
        uVar21 = uVar21 + 1;
      } while (uVar23 != uVar21);
    }
    pdVar11 = local_98;
    if ((local_a8 != 0.0) || (NAN(local_a8))) {
      *(undefined8 *)(puVar17 + -8) = 0x10af68;
      xvm_free(pdVar11);
    }
    pgVar7 = local_e0;
    *(undefined8 *)(puVar17 + -8) = 0x10af74;
    grd_free(pgVar7);
    return;
  }
  local_100 = uVar24 * 8;
  local_31 = uVar24 == 0 || local_a8 == 0.0;
  uVar19 = (uint)local_40;
  local_68 = 0;
  local_c4 = uVar19;
  do {
    pdVar22 = local_78;
    pdVar12 = local_d0;
    nftr = (uint64_t)(uVar19 + 1);
    uVar19 = (uint)local_68;
    if ((uint)local_40 < (uint)local_68) {
      uVar19 = (uint)local_40;
    }
    if (((local_a8 != 0.0) || (pdVar16 = local_78, NAN(local_a8))) &&
       (pdVar16 = local_98, uVar24 != 0)) {
      dVar14 = local_a0->opt->rho1;
      uVar15 = 0;
      do {
        if (0.0 <= local_50[uVar15]) {
          dVar27 = local_78[uVar15];
          if ((0.0 < local_50[uVar15]) || (dVar27 < -dVar14)) {
            dVar29 = dVar27 + dVar14;
          }
          else {
            dVar29 = 0.0;
            if (dVar14 < dVar27) {
              dVar29 = dVar27 - dVar14;
            }
          }
        }
        else {
          dVar29 = local_78[uVar15] - dVar14;
        }
        local_98[uVar15] = dVar29;
        uVar15 = uVar15 + 1;
      } while (uVar24 != uVar15);
    }
    local_130 = pdVar16;
    *(undefined8 *)(puVar17 + -8) = 0x10a7d3;
    xvm_neg(pdVar12,pdVar16,uVar24);
    pdVar12 = local_d0;
    if ((uint)local_68 != 0) {
      iVar10 = -uVar19;
      uVar5 = (uint)local_40;
      if ((uint)local_68 < (uint)local_40) {
        uVar5 = (uint)local_68;
      }
      local_80 = (double)CONCAT44(local_80._4_4_,uVar5);
      dVar14 = (double)((long)puVar17 - local_128);
      pdVar11 = (double *)((ulong)(uVar19 - 1) * 8 + (long)dVar14);
      local_b8 = puVar17;
      local_b0 = dVar14;
      do {
        uVar23 = (ulong)(uint)((int)nftr + iVar10) % (local_40 & 0xffffffff);
        local_48 = *(double *)(local_88 + uVar23 * 8);
        pdVar22 = *(double **)(local_60 + uVar23 * 8);
        *(undefined8 *)((long)dVar14 + -8) = 0x10a851;
        dVar27 = xvm_dot(pdVar22,pdVar12,uVar24);
        dVar27 = dVar27 * local_48;
        *pdVar11 = dVar27;
        pdVar22 = *(double **)(local_70 + uVar23 * 8);
        *(undefined8 *)((long)dVar14 + -8) = 0x10a87a;
        xvm_axpy(pdVar12,-dVar27,pdVar22,pdVar12,uVar24);
        pdVar11 = pdVar11 + -1;
        iVar10 = iVar10 + 1;
      } while (iVar10 != 0);
      uVar23 = (local_68 & 0xffffffff) % (local_40 & 0xffffffff);
      pdVar11 = *(double **)(local_70 + uVar23 * 8);
      *(undefined8 *)((long)dVar14 + -8) = 0x10a8a1;
      dVar27 = xvm_dot(pdVar11,pdVar11,uVar24);
      if (uVar24 != 0) {
        dVar29 = *(double *)(local_88 + uVar23 * 8);
        uVar15 = 0;
        do {
          pdVar12[uVar15] = pdVar12[uVar15] * (1.0 / (dVar27 * dVar29));
          uVar15 = uVar15 + 1;
        } while (uVar24 != uVar15);
      }
      local_80 = (double)((ulong)local_80 & 0xffffffff);
      dVar27 = 0.0;
      uVar19 = local_c4;
      do {
        uVar23 = (ulong)uVar19 % (local_40 & 0xffffffff);
        local_48 = *(double *)(local_88 + uVar23 * 8);
        pdVar11 = *(double **)(local_70 + uVar23 * 8);
        *(undefined8 *)((long)dVar14 + -8) = 0x10a911;
        dVar28 = xvm_dot(pdVar11,pdVar12,uVar24);
        dVar28 = dVar28 * local_48;
        dVar29 = *(double *)((long)local_b0 + (long)dVar27 * 8);
        pdVar11 = *(double **)(local_60 + uVar23 * 8);
        *(undefined8 *)((long)dVar14 + -8) = 0x10a941;
        xvm_axpy(pdVar12,dVar29 - dVar28,pdVar11,pdVar12,uVar24);
        dVar27 = (double)((long)dVar27 + 1);
        uVar19 = uVar19 - 1;
        pdVar22 = local_78;
        puVar17 = local_b8;
        pdVar11 = local_d8;
      } while ((ulong)dVar27 < (ulong)local_80);
    }
    pdVar16 = local_50;
    pdVar12 = local_d0;
    sVar6 = local_100;
    if (local_31 == '\0') {
      uVar15 = 0;
      do {
        if (0.0 <= local_d0[uVar15] * local_98[uVar15]) {
          local_d0[uVar15] = 0.0;
        }
        uVar15 = uVar15 + 1;
      } while (uVar24 != uVar15);
    }
    *(undefined8 *)(puVar17 + -8) = 0x10a9b1;
    memcpy(pdVar11,pdVar16,sVar6);
    pdVar16 = local_c0;
    *(undefined8 *)(puVar17 + -8) = 0x10a9c3;
    memcpy(pdVar16,pdVar22,sVar6);
    dVar14 = 1.0;
    bVar26 = (uint)local_68 == 0;
    if (bVar26) {
      *(undefined8 *)(puVar17 + -8) = 0x10a9e2;
      dVar14 = xvm_norm(pdVar12,uVar24);
      dVar14 = 1.0 / dVar14;
    }
    pdVar22 = local_78;
    local_b8 = (undefined1 *)0x0;
    if ((local_a8 == 0.0) && (!NAN(local_a8))) {
      local_48 = dVar14;
      *(undefined8 *)(puVar17 + -8) = 0x10aa22;
      local_b8 = (undefined1 *)xvm_dot(pdVar22,pdVar12,uVar24);
      dVar14 = local_48;
    }
    pdVar22 = local_78;
    if (uit_stop == false) {
      dVar27 = *(double *)(&DAT_00112280 + (ulong)bVar26 * 8);
      local_138 = (double)local_b8 * 0.9;
      uVar20 = 1;
      do {
        pdVar16 = local_50;
        local_b0 = dVar27;
        local_48 = dVar14;
        *(undefined8 *)(puVar17 + -8) = 0x10aa99;
        xvm_axpy(pdVar16,dVar14,pdVar12,pdVar11,uVar24);
        pgVar7 = local_e0;
        if (local_31 == '\0') {
          uVar15 = 0;
          do {
            dVar14 = pdVar11[uVar15];
            if ((dVar14 == 0.0) && (!NAN(dVar14))) {
              dVar14 = -local_98[uVar15];
            }
            if (dVar14 * local_50[uVar15] <= 0.0) {
              local_50[uVar15] = 0.0;
            }
            uVar15 = uVar15 + 1;
          } while (uVar24 != uVar15);
        }
        *(undefined8 *)(puVar17 + -8) = 0x10aaf6;
        local_80 = grd_gradient(pgVar7);
        if ((local_a8 != 0.0) || (NAN(local_a8))) {
          dVar14 = 0.0;
          if (uVar24 != 0) {
            uVar15 = 0;
            do {
              dVar14 = dVar14 + (local_50[uVar15] - pdVar11[uVar15]) * pdVar12[uVar15];
              uVar15 = uVar15 + 1;
            } while (uVar24 != uVar15);
          }
          dVar27 = local_b0;
          if (local_80 < dVar14 * 0.0001 + local_58) {
LAB_0010ac21:
            bVar26 = false;
            local_58 = local_80;
            goto LAB_0010ac28;
          }
        }
        else {
          dVar27 = 0.5;
          if (local_80 <= (double)local_b8 * local_48 * 0.0001 + local_58) {
            *(undefined8 *)(puVar17 + -8) = 0x10ab55;
            dVar14 = xvm_dot(pdVar22,pdVar12,uVar24);
            dVar27 = 2.1;
            if (local_138 <= dVar14) goto LAB_0010ac21;
          }
        }
        if (uVar20 == (local_a0->opt->lbfgs).maxls) {
          *(undefined8 *)(puVar17 + -8) = 0x10ac0f;
          warning("maximum linesearch reached");
          bVar26 = true;
          goto LAB_0010ac15;
        }
        uVar20 = uVar20 + 1;
        dVar14 = local_48 * dVar27;
      } while (uit_stop != true);
      bVar26 = false;
LAB_0010ac15:
      local_58 = local_80;
    }
    else {
      bVar26 = false;
    }
LAB_0010ac28:
    pdVar12 = local_50;
    dVar14 = local_58;
    pmVar8 = local_a0;
    sVar6 = local_100;
    if ((bVar26) || (uit_stop == true)) {
      *(undefined8 *)(puVar17 + -8) = 0x10adca;
      memcpy(pdVar12,pdVar11,sVar6);
      goto LAB_0010adca;
    }
    uVar20 = (int)local_68 + 1;
    *(undefined8 *)(puVar17 + -8) = 0x10ac5a;
    _Var9 = uit_progress(pmVar8,uVar20,dVar14);
    pdVar12 = local_50;
    if (!_Var9) goto LAB_0010adca;
    uVar23 = (ulong)uVar20 % (local_40 & 0xffffffff);
    pdVar22 = *(double **)(local_60 + uVar23 * 8);
    *(undefined8 *)(puVar17 + -8) = 0x10ac86;
    xvm_sub(pdVar22,pdVar12,pdVar11,uVar24);
    x = local_78;
    pdVar16 = local_c0;
    local_48 = (double)CONCAT44(local_48._4_4_,uVar20);
    pdVar12 = *(double **)(local_70 + uVar23 * 8);
    *(undefined8 *)(puVar17 + -8) = 0x10aca7;
    xvm_sub(pdVar12,x,pdVar16,uVar24);
    dVar14 = local_48;
    uVar5 = local_48._0_4_;
    uVar21 = (ulong)local_48 & 0xffffffff;
    *(undefined8 *)(puVar17 + -8) = 0x10acb8;
    dVar27 = xvm_dot(pdVar12,pdVar22,uVar24);
    pdVar12 = local_50;
    *(double *)(local_88 + uVar23 * 8) = 1.0 / dVar27;
    *(undefined8 *)(puVar17 + -8) = 0x10acda;
    local_b0 = xvm_norm(pdVar12,uVar24);
    pdVar12 = local_130;
    *(undefined8 *)(puVar17 + -8) = 0x10acf1;
    dVar29 = xvm_norm(pdVar12,uVar24);
    dVar27 = 1.0;
    if (1.0 <= local_b0) {
      dVar27 = local_b0;
    }
    if ((((dVar29 / dVar27 <= 1e-05) || (uVar5 == local_8c)) ||
        ((*(double *)(local_108 + ((local_68 & 0xffffffff) % (local_110 & 0xffffffff)) * 8) =
               local_58, (uint)local_110 <= (uint)local_68 &&
         (ABS(*(double *)(local_108 + (((ulong)dVar14 & 0xffffffff) % (local_110 & 0xffffffff)) * 8)
              - local_58) /
          *(double *)(local_108 + (((ulong)dVar14 & 0xffffffff) % (local_110 & 0xffffffff)) * 8) <
          local_a0->opt->stopeps)))) || (uit_stop != false)) goto LAB_0010adca;
    uVar19 = (uint)nftr;
    local_c4 = local_c4 + 1;
    local_68 = uVar21;
    if (local_8c <= uVar5) goto LAB_0010adca;
  } while( true );
}

Assistant:

void trn_lbfgs(mdl_t *mdl) {
	const uint64_t F  = mdl->nftr;
	const uint32_t K  = mdl->opt->maxiter;
	const uint32_t C  = mdl->opt->objwin;
	const uint32_t M  = mdl->opt->lbfgs.histsz;
	const bool     l1 = mdl->opt->rho1 != 0.0;
	double *x, *xp; // Current and previous value of the variables
	double *g, *gp; // Current and previous value of the gradient
	double *pg;     // The pseudo-gradient (only for owl-qn)
	double *d;      // The search direction
	double *s[M];   // History value s_k = Δ(x,px)
	double *y[M];   // History value y_k = Δ(g,pg)
	double  p[M];   // ρ_k
	double  fh[C];  // f(x) history
	// Initialization: Here, we have to allocate memory on the heap as we
	// cannot request so much memory on the stack as this will have a too
	// big impact on performance and will be refused by the system on non-
	// trivial models.
	x  = mdl->theta;
	xp = xvm_new(F); g = xvm_new(F);
	gp = xvm_new(F); d = xvm_new(F);
	for (uint32_t m = 0; m < M; m++) {
		s[m] = xvm_new(F);
		y[m] = xvm_new(F);
	}
	pg = l1 ? xvm_new(F) : NULL;
	grd_t *grd = grd_new(mdl, g);
	// Restore a saved state if user specified one.
	if (mdl->opt->rstate != NULL) {
		const char *err = "invalid state file";
		FILE *file = fopen(mdl->opt->rstate, "r");
		if (file == NULL)
			fatal("failed to open input state file");
		int type, histsz;
		uint64_t nftr;
		if (fscanf(file, "#state#%d#%d#%"SCNu64"\n", &type, &histsz,
				&nftr) != 3)
			fatal("0 %s", err);
		if (type != 0 || histsz != (int)M)
			fatal("state is not compatible");
		for (uint64_t i = 0; i < nftr; i++) {
			uint64_t f;
			if (fscanf(file, "%"PRIu64, &f) != 1)
				fatal("1 %s", err);
			if (fscanf(file, "%la %la", &xp[f], &gp[f]) != 2)
				fatal("2 %s", err);
			for (uint32_t m = 0; m < M; m++) {
				if (fscanf(file, "%la", &s[m][f]) != 1)
					fatal("3 %s", err);
				if (fscanf(file, "%la", &y[m][f]) != 1)
					fatal("4 %s", err);
			}
		}
		for (uint32_t m = 0; m < M; m++)
			p[m] = 1.0 / xvm_dot(y[m], s[m], F);
		fclose(file);
	}
	// Minimization: This is the heart of the function. (a big heart...) We
	// will perform iterations until one these conditions is reached
	//   - the maximum iteration count is reached
	//   - we have converged (upto numerical precision)
	//   - the report function return false
	//   - an error happen somewhere
	double fx = grd_gradient(grd);
	for (uint32_t k = 0; !uit_stop && k < K; k++) {
		// We first compute the pseudo-gradient of f for owl-qn. It is
		// defined in [3, pp 335(4)]
		//              | ∂_i^- f(x)   if ∂_i^- f(x) > 0
		//   ◇_i f(x) = | ∂_i^+ f(x)   if ∂_i^+ f(x) < 0
		//              | 0            otherwise
		// with
		//   ∂_i^± f(x) = ∂/∂x_i l(x) + | Cσ(x_i) if x_i ≠ 0
		//                              | ±C      if x_i = 0
		if (l1) {
			const double rho1 = mdl->opt->rho1;
			for (uint64_t f = 0; f < F; f++) {
				if (x[f] < 0.0)
					pg[f] = g[f] - rho1;
				else if (x[f] > 0.0)
					pg[f] = g[f] + rho1;
				else if (g[f] < -rho1)
					pg[f] = g[f] + rho1;
				else if (g[f] > rho1)
					pg[f] = g[f] - rho1;
				else
					pg[f] = 0.0;
			}
		}
		// 1st step: We compute the search direction. We search in the
		// direction who minimize the second order approximation given
		// by the Taylor series which give
		//   d_k = - H_k^{-1} g_k
		// But computing the inverse of the hessian is intractable so
		// the l-bfgs only approximate it's diagonal. The exact
		// computation is well described in [1, pp 779].
		// The only special thing for owl-qn here is to use the pseudo
		// gradient instead of the true one.
		xvm_neg(d, l1 ? pg : g, F);
		if (k != 0) {
			const uint32_t km = k % M;
			const uint32_t bnd = (k <= M) ? k : M;
			double alpha[M], beta;
			// α_i = ρ_j s_j^T q_{i+1}
			// q_i = q_{i+1} - α_i y_i
			for (uint32_t i = bnd; i > 0; i--) {
				const uint32_t j = (M + 1 + k - i) % M;
				alpha[i - 1] = p[j] * xvm_dot(s[j], d, F);
				xvm_axpy(d, -alpha[i - 1], y[j], d, F);
			}
			// r_0 = H_0 q_0
			//     Scaling is described in [2, pp 515]
			//     for k = 0: H_0 = I
			//     for k > 0: H_0 = I * y_k^T s_k / ||y_k||²
			//                    = I * 1 / ρ_k ||y_k||²
			const double y2 = xvm_dot(y[km], y[km], F);
			const double v = 1.0 / (p[km] * y2);
			for (uint64_t f = 0; f < F; f++)
				d[f] *= v;
			// β_j     = ρ_j y_j^T r_i
			// r_{i+1} = r_i + s_j (α_i - β_i)
			for (uint32_t i = 0; i < bnd; i++) {
				const uint32_t j = (M + k - i) % M;
				beta = p[j] * xvm_dot(y[j], d, F);
				xvm_axpy(d, alpha[i] - beta, s[j], d, F);
			}
		}
		// For owl-qn, we must remain in the same orthant than the
		// pseudo-gradient, so we have to constrain the search
		// direction as described in [3, pp 35(3)]
		//   d^k = π(d^k ; v^k)
		//       = π(d^k ; -◇f(x^k))
		if (l1)
			for (uint64_t f = 0; f < F; f++)
				if (d[f] * pg[f] >= 0.0)
					d[f] = 0.0;
		// 2nd step: we perform a linesearch in the computed direction,
		// we search a step value that satisfy the constrains using a
		// backtracking algorithm. Much elaborated algorithm can perform
		// better in the general case, but for CRF training, bactracking
		// is very efficient and simple to implement.
		// For quasi-Newton, the natural step is 1.0 so we start with
		// this one and reduce it only if it fail with an exception for
		// the first step where a better guess can be done.
		// We have to keep track of the current point and gradient as we
		// will need to compute the delta between those and the found
		// point, and perhaps need to restore them if linesearch fail.
		memcpy(xp, x, sizeof(double) * F);
		memcpy(gp, g, sizeof(double) * F);
		double sc  = (k == 0) ? 0.1 : 0.5;
		double stp = (k == 0) ? 1.0 / xvm_norm(d, F) : 1.0;
		double gd  = l1 ? 0.0 : xvm_dot(g, d, F); // gd = g_k^T d_k
		double fi  = fx;
		bool err = false;
		for (uint32_t ls = 1; !uit_stop; ls++, stp *= sc) {
			// We compute the new point using the current step and
			// search direction
			xvm_axpy(x, stp, d, xp, F);
			// For owl-qn, we have to project back the point in the
			// current orthant [3, pp 35]
			//   x^{k+1} = π(x^k + αp^k ; ξ)
			if (l1) {
				for (uint64_t f = 0; f < F; f++) {
					double or = xp[f];
					if (or == 0.0)
						or = -pg[f];
					if (x[f] * or <= 0.0)
						x[f] = 0.0;
				}
			}
			// And we ask for the value of the objective function
			// and its gradient.
			fx = grd_gradient(grd);
			// Now we check if the step satisfy the conditions. For
			// l-bfgs, we check the classical decrease and curvature
			// known as the Wolfe conditions [2, pp 506]
			//   f(x_k + α_k d_k) ≤ f(x_k) + β' α_k g_k^T d_k
			//   g(x_k + α_k d_k)^T d_k ≥ β g_k^T d_k
			//
			// And for owl-qn we check a variant of the Armijo rule
			// described in [3, pp 36]
			//   f(π(x^k+αp^k;ξ)) ≤ f(x^k) - γv^T[π(x^k+αp^k;ξ)-x^k]
			if (!l1) {
				if (fx > fi + stp * gd * 1e-4)
					sc = 0.5;
				else if (xvm_dot(g, d, F) < gd * 0.9)
					sc = 2.1;
				else
					break;
			} else {
				double vp = 0.0;
				for (uint64_t f = 0; f < F; f++)
					vp += (x[f] - xp[f]) * d[f];
				if (fx < fi + vp * 1e-4)
					break;
			}
			// If we reach the maximum number of linesearsh steps
			// without finding a good one, we just fail.
			if (ls == mdl->opt->lbfgs.maxls) {
				warning("maximum linesearch reached");
				err = true;
				break;
			}
		}
		// If linesearch failed or user interupted training, we return
		// to the last valid point and stop the training. The model is
		// probably not fully optimized but we let the user decide what
		// to do with it.
		if (err || uit_stop) {
			memcpy(x, xp, sizeof(double) * F);
			break;
		}
		if (uit_progress(mdl, k + 1, fx) == false)
			break;
		// 3rd step: we update the history used for approximating the
		// inverse of the diagonal of the hessian
		//   s_k = x_{k+1} - x_k
		//   y_k = g_{k+1} - g_k
		//   ρ_k = 1 / y_k^T s_k
		const uint32_t kn = (k + 1) % M;
		xvm_sub(s[kn], x, xp, F);
		xvm_sub(y[kn], g, gp, F);
		p[kn] = 1.0 / xvm_dot(y[kn], s[kn], F);
		// And last, we check for convergence. The convergence check is
		// quite simple [2, pp 508]
		//   ||g|| / max(1, ||x||) ≤ ε
		// with ε small enough so we stop when numerical precision is
		// reached. For owl-qn we just have to check against the pseudo-
		// gradient instead of the true one.
		const double xn = xvm_norm(x, F);
		const double gn = xvm_norm(l1 ? pg : g, F);
		if (gn / max(xn, 1.0) <= 1e-5)
			break;
		if (k + 1 == K)
			break;
		// Second stoping criterion tested is a check for improvement of
		// the function value over the past W iteration. When this come
		// under an epsilon, we also stop the minimization.
		fh[k % C] = fx;
		double dlt = 1.0;
		if (k >= C) {
			const double of = fh[(k + 1) % C];
			dlt = fabs(of - fx) / of;
			if (dlt < mdl->opt->stopeps)
				break;
		}
	}
	// Save the optimizer state if requested by the user
	if (mdl->opt->sstate != NULL) {
		FILE *file = fopen(mdl->opt->sstate, "w");
		if (file == NULL)
			fatal("failed to open output state file");
		fprintf(file, "#state#0#%"PRIu32"#%"PRIu64"\n", M, F);
		for (uint64_t f = 0; f < F; f++) {
			fprintf(file, "%"PRIu64, f);
			fprintf(file, " %la %la", xp[f], gp[f]);
			for (uint32_t m = 0; m < M; m++)
				fprintf(file, " %la %la", s[m][f], y[m][f]);
			fprintf(file, "\n");
		}
		fclose(file);
	}
	// Cleanup: We free all the vectors we have allocated.
	xvm_free(xp); xvm_free(g);
	xvm_free(gp); xvm_free(d);
	for (uint32_t m = 0; m < M; m++) {
		xvm_free(s[m]);
		xvm_free(y[m]);
	}
	if (l1)
		xvm_free(pg);
	grd_free(grd);
}